

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O2

void __thiscall
CECoordinates::CECoordinates
          (CECoordinates *this,vector<double,_std::allocator<double>_> *xcoord,
          vector<double,_std::allocator<double>_> *ycoord,CECoordinateType *coord_type)

{
  CEAngle y;
  CEAngle x;
  CEAngle CStack_68;
  CEAngle local_58;
  CEAngle local_48;
  double local_38;
  
  this->_vptr_CECoordinates = (_func_int **)&PTR__CECoordinates_00146738;
  CEAngle::CEAngle(&this->xcoord_);
  CEAngle::CEAngle(&this->ycoord_);
  init_members(this);
  CEAngle::CEAngle(&local_58);
  if ((*coord_type & ~ICRS) == GALACTIC) {
    CEAngle::Dms(&CStack_68,xcoord);
    CEAngle::operator=(&local_58,&CStack_68);
  }
  else {
    CEAngle::Hms(&CStack_68,xcoord);
    CEAngle::operator=(&local_58,&CStack_68);
  }
  CEAngle::~CEAngle(&CStack_68);
  CEAngle::Dms(&local_48,ycoord);
  local_38 = CEAngle::operator_cast_to_double(&local_48);
  CEAngle::CEAngle(&CStack_68,&local_38);
  CEAngle::~CEAngle(&local_48);
  SetCoordinates(this,&local_58,&CStack_68,coord_type);
  CEAngle::~CEAngle(&CStack_68);
  CEAngle::~CEAngle(&local_58);
  return;
}

Assistant:

CECoordinates::CECoordinates(const std::vector<double>& xcoord,
                             const std::vector<double>& ycoord,
                             const CECoordinateType& coord_type)
{
    init_members();
    CEAngle x;
    if ((coord_type == CECoordinateType::GALACTIC) || 
        (coord_type == CECoordinateType::OBSERVED)) {
        x = CEAngle::Dms(xcoord);
    } else {
        x = CEAngle::Hms(xcoord);
    }
    CEAngle y = CEAngle::Dms(ycoord);
    CECoordinates::SetCoordinates(x, y, coord_type);
}